

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

void Ifd_ManHashInsert(Ifd_Man_t *p,int iDsd0,int iDsd1,int iDsdC,int Type,int Res)

{
  int iVar1;
  
  if (iDsd0 < iDsd1 && iDsdC == -1) {
    __assert_fail("iDsdC != -1 || iDsd0 >= iDsd1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0x172,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
  }
  if (iDsdC != -1) {
    iVar1 = Abc_LitIsCompl(iDsd1);
    if (iVar1 != 0) {
      __assert_fail("iDsdC == -1 || !Abc_LitIsCompl(iDsd1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                    ,0x173,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
    }
  }
  Vec_IntPush(p->vArgs,iDsd0);
  Vec_IntPush(p->vArgs,iDsd1);
  Vec_IntPush(p->vArgs,iDsdC);
  Vec_IntPush(p->vArgs,Type);
  iVar1 = Hsh_IntManAdd(p->vHash,p->vRes->nSize);
  if (iVar1 == p->vRes->nSize) {
    Vec_IntPush(p->vRes,Res);
    if (p->vRes->nSize << 2 == p->vArgs->nSize) {
      return;
    }
    __assert_fail("4 * Vec_IntSize(p->vRes) == Vec_IntSize(p->vArgs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                  ,0x17b,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
  }
  __assert_fail("iObj == Vec_IntSize(p->vRes)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmPre.c"
                ,0x179,"void Ifd_ManHashInsert(Ifd_Man_t *, int, int, int, int, int)");
}

Assistant:

void Ifd_ManHashInsert( Ifd_Man_t * p, int iDsd0, int iDsd1, int iDsdC, int Type, int Res )
{
    int iObj;
    assert( iDsdC != -1 || iDsd0 >= iDsd1 );
    assert( iDsdC == -1 || !Abc_LitIsCompl(iDsd1) );
    Vec_IntPush( p->vArgs, iDsd0 );
    Vec_IntPush( p->vArgs, iDsd1 );
    Vec_IntPush( p->vArgs, iDsdC );
    Vec_IntPush( p->vArgs, Type );
    iObj = Hsh_IntManAdd( p->vHash, Vec_IntSize(p->vRes) );
    assert( iObj == Vec_IntSize(p->vRes) );
    Vec_IntPush( p->vRes, Res );
    assert( 4 * Vec_IntSize(p->vRes) == Vec_IntSize(p->vArgs) );
}